

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O0

int Test_SUNMatClone(SUNMatrix A,int myid)

{
  int iVar1;
  SUNMatrix A_00;
  uint in_ESI;
  SUNMatrix in_RDI;
  double dVar2;
  double dVar3;
  SUNMatrix B;
  sunrealtype tol;
  double stop_time;
  double start_time;
  int failure;
  sunrealtype in_stack_00000058;
  SUNMatrix in_stack_00000060;
  SUNMatrix in_stack_00000068;
  int local_4;
  
  dVar2 = get_time();
  A_00 = (SUNMatrix)SUNMatClone(in_RDI);
  sync_device(in_RDI);
  dVar3 = get_time();
  if (A_00 == (SUNMatrix)0x0) {
    if ((print_all_ranks == 0) && (in_ESI == 0)) {
      printf(">>> FAILED test -- SUNMatClone \n");
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)in_ESI);
      printf(">>> FAILED test -- SUNMatClone \n");
    }
    if ((print_all_ranks == 0) && (in_ESI == 0)) {
      printf("    After SUNMatClone, B == NULL \n \n");
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)in_ESI);
      printf("    After SUNMatClone, B == NULL \n \n");
    }
    local_4 = 1;
  }
  else {
    iVar1 = has_data(A_00);
    if (iVar1 == 0) {
      if ((print_all_ranks == 0) && (in_ESI == 0)) {
        printf(">>> FAILED test -- SUNMatClone \n");
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",(ulong)in_ESI);
        printf(">>> FAILED test -- SUNMatClone \n");
      }
      if ((print_all_ranks == 0) && (in_ESI == 0)) {
        printf("    Matrix data == NULL \n \n");
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",(ulong)in_ESI);
        printf("    Matrix data == NULL \n \n");
      }
      SUNMatDestroy(A_00);
      local_4 = 1;
    }
    else {
      iVar1 = SUNMatCopy(in_RDI,A_00);
      if (iVar1 == 0) {
        iVar1 = check_matrix(in_stack_00000068,in_stack_00000060,in_stack_00000058);
        if (iVar1 == 0) {
          if ((print_all_ranks == 0) && (in_ESI == 0)) {
            printf("    PASSED test -- SUNMatClone \n");
          }
          else if (print_all_ranks != 0) {
            printf("process %06d: ",(ulong)in_ESI);
            printf("    PASSED test -- SUNMatClone \n");
          }
          if ((in_ESI == 0) && (print_time != 0)) {
            printf("    SUNMatClone Time: %22.15e \n \n",dVar3 - dVar2);
          }
          SUNMatDestroy(A_00);
          local_4 = 0;
        }
        else {
          if ((print_all_ranks == 0) && (in_ESI == 0)) {
            printf(">>> FAILED test -- SUNMatClone \n");
          }
          else if (print_all_ranks != 0) {
            printf("process %06d: ",(ulong)in_ESI);
            printf(">>> FAILED test -- SUNMatClone \n");
          }
          if ((print_all_ranks == 0) && (in_ESI == 0)) {
            printf("    Failed SUNMatClone check \n \n");
          }
          else if (print_all_ranks != 0) {
            printf("process %06d: ",(ulong)in_ESI);
            printf("    Failed SUNMatClone check \n \n");
          }
          SUNMatDestroy(A_00);
          local_4 = 1;
        }
      }
      else {
        if ((print_all_ranks == 0) && (in_ESI == 0)) {
          printf(">>> FAILED test -- SUNMatClone (error using SUNMatCopy) \n");
        }
        else if (print_all_ranks != 0) {
          printf("process %06d: ",(ulong)in_ESI);
          printf(">>> FAILED test -- SUNMatClone (error using SUNMatCopy) \n");
        }
        SUNMatDestroy(A_00);
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int Test_SUNMatClone(SUNMatrix A, int myid)
{
  int failure;
  double start_time, stop_time;
  sunrealtype tol = 10 * SUN_UNIT_ROUNDOFF;
  SUNMatrix B;

  /* clone matrix */
  start_time = get_time();
  B          = SUNMatClone(A);
  sync_device(A);
  stop_time = get_time();

  /* check cloned matrix */
  if (B == NULL)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatClone \n", myid);
    TEST_STATUS("    After SUNMatClone, B == NULL \n \n", myid);
    return (1);
  }

  /* check cloned matrix data */
  if (!has_data(B))
  {
    TEST_STATUS(">>> FAILED test -- SUNMatClone \n", myid);
    TEST_STATUS("    Matrix data == NULL \n \n", myid);
    SUNMatDestroy(B);
    return (1);
  }

  failure = SUNMatCopy(A, B);
  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatClone (error using SUNMatCopy) \n",
                myid);
    SUNMatDestroy(B);
    return (1);
  }

  failure = check_matrix(A, B, tol);
  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatClone \n", myid);
    TEST_STATUS("    Failed SUNMatClone check \n \n", myid);
    SUNMatDestroy(B);
    return (1);
  }
  else { TEST_STATUS("    PASSED test -- SUNMatClone \n", myid); }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatClone Time: %22.15e \n \n", stop_time - start_time);
  }

  SUNMatDestroy(B);
  return (0);
}